

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void cleanAndroidFiles(Options *options)

{
  long in_FS_OFFSET;
  QString local_68;
  QDir local_50 [8];
  QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_QLatin1String>
  local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((options->androidSourceDirectory).d.size != 0) {
    QDir::QDir((QDir *)&local_48,&options->androidSourceDirectory);
    cleanTopFolders(options,(QDir *)&local_48,&options->outputDirectory);
    QDir::~QDir((QDir *)&local_48);
  }
  local_48.a.a.a = &options->qtInstallDirectory;
  local_48.a.b = &options->qtDataDirectory;
  local_48.a.a.b = L'/';
  local_48.b.m_size = 0x16;
  local_48.b.m_data = "/src/android/templates";
  QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_QLatin1String>
  ::convertTo<QString>(&local_68,&local_48);
  QDir::QDir(local_50,&local_68);
  cleanTopFolders(options,local_50,&options->outputDirectory);
  QDir::~QDir(local_50);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void cleanAndroidFiles(const Options &options)
{
    if (!options.androidSourceDirectory.isEmpty())
        cleanTopFolders(options, QDir(options.androidSourceDirectory), options.outputDirectory);

    cleanTopFolders(options,
                    QDir(options.qtInstallDirectory + u'/' +
                         options.qtDataDirectory + "/src/android/templates"_L1),
                    options.outputDirectory);
}